

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int has_prec(int val)

{
  undefined4 local_c;
  int val_local;
  
  if (val < 2) {
    local_c = 1;
  }
  else if (val < 4) {
    local_c = 2;
  }
  else if (val < 8) {
    local_c = 3;
  }
  else if (val < 0x10) {
    local_c = 4;
  }
  else if (val < 0x20) {
    local_c = 5;
  }
  else if (val < 0x40) {
    local_c = 6;
  }
  else if (val < 0x80) {
    local_c = 7;
  }
  else if (val < 0x100) {
    local_c = 8;
  }
  else if (val < 0x200) {
    local_c = 9;
  }
  else if (val < 0x400) {
    local_c = 10;
  }
  else if (val < 0x800) {
    local_c = 0xb;
  }
  else if (val < 0x1000) {
    local_c = 0xc;
  }
  else if (val < 0x2000) {
    local_c = 0xd;
  }
  else if (val < 0x4000) {
    local_c = 0xe;
  }
  else if (val < 0x8000) {
    local_c = 0xf;
  }
  else {
    local_c = 0x10;
  }
  return local_c;
}

Assistant:

static int has_prec(int val)
{
    if (val < 2) {
        return 1;
    }
    if (val < 4) {
        return 2;
    }
    if (val < 8) {
        return 3;
    }
    if (val < 16) {
        return 4;
    }
    if (val < 32) {
        return 5;
    }
    if (val < 64) {
        return 6;
    }
    if (val < 128) {
        return 7;
    }
    if (val < 256) {
        return 8;
    }
    if (val < 512) {
        return 9;
    }
    if (val < 1024) {
        return 10;
    }
    if (val < 2048) {
        return 11;
    }
    if (val < 4096) {
        return 12;
    }
    if (val < 8192) {
        return 13;
    }
    if (val < 16384) {
        return 14;
    }
    if (val < 32768) {
        return 15;
    }
    return 16;
}